

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O3

Variable __thiscall LiteScript::ClassObject::GetMember(ClassObject *this,char *name)

{
  int iVar1;
  ulong uVar2;
  uint *extraout_RDX;
  long lVar4;
  Variable VVar5;
  uint *puVar3;
  
  uVar2 = (*(long *)(name + 8) - *(long *)name >> 4) * -0x5555555555555555;
  if ((int)uVar2 != 0) {
    lVar4 = 0;
    do {
      iVar1 = std::__cxx11::string::compare((char *)(*(long *)name + lVar4));
      if (iVar1 == 0) {
        Variable::Variable((Variable *)this,(Variable *)(*(long *)name + lVar4 + 0x20));
        puVar3 = extraout_RDX;
        goto LAB_0013f633;
      }
      lVar4 = lVar4 + 0x30;
    } while ((uVar2 & 0xffffffff) * 0x30 != lVar4);
  }
  VVar5 = Class::GetUnstaticMember((Class *)this,*(char **)(name + 0x38));
  puVar3 = VVar5.nb_ref;
LAB_0013f633:
  VVar5.nb_ref = puVar3;
  VVar5.obj = (Object *)this;
  return VVar5;
}

Assistant:

LiteScript::Variable LiteScript::ClassObject::GetMember(const char *name) {
    for (unsigned int i = 0, sz = this->members.size(); i < sz; i++) {
        if (this->members[i].first == name)
            return Variable(this->members[i].second);
    }
    return this->ClassBase->GetUnstaticMember(name);
}